

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

void canvas_reflecttitle(_glist *x)

{
  ushort uVar1;
  t_atom *ptVar2;
  int iVar3;
  _canvasenvironment *p_Var4;
  size_t sVar5;
  t_symbol *ptVar6;
  long lVar7;
  long lVar8;
  char namebuf [1000];
  undefined2 local_418;
  undefined1 local_416;
  undefined1 local_31;
  
  p_Var4 = canvas_getenv(x);
  uVar1 = *(ushort *)&x->field_0xe8;
  if ((uVar1 & 1) == 0) {
    bug("canvas_reflecttitle");
    return;
  }
  iVar3 = p_Var4->ce_argc;
  if (iVar3 == 0) {
    local_418 = (ushort)local_418._1_1_ << 8;
  }
  else {
    local_416 = 0;
    local_418 = 0x2820;
    lVar8 = 0;
    for (lVar7 = 0; lVar7 < iVar3; lVar7 = lVar7 + 1) {
      sVar5 = strlen((char *)&local_418);
      if (0x1ef < sVar5) break;
      if (lVar8 != 0) {
        sVar5 = strlen((char *)&local_418);
        *(undefined2 *)((long)&local_418 + sVar5) = 0x20;
      }
      ptVar2 = p_Var4->ce_argv;
      sVar5 = strlen((char *)&local_418);
      atom_string((t_atom *)((long)&ptVar2->a_type + lVar8),(char *)((long)&local_418 + sVar5),500);
      iVar3 = p_Var4->ce_argc;
      lVar8 = lVar8 + 0x10;
    }
    sVar5 = strlen((char *)&local_418);
    *(undefined2 *)((long)&local_418 + sVar5) = 0x29;
    uVar1 = *(ushort *)&x->field_0xe8;
  }
  if ((uVar1 & 0x20) != 0) {
    sVar5 = strlen((char *)&local_418);
    strncat((char *)&local_418," [edit]",999 - sVar5);
    local_31 = 0;
  }
  ptVar6 = canvas_getdir(x);
  pdgui_vmess("pdtk_canvas_reflecttitle","^ sss i",x,ptVar6->s_name,x->gl_name->s_name,&local_418,
              *(uint *)&x->field_0xe8 >> 2 & 1);
  return;
}

Assistant:

void canvas_reflecttitle(t_canvas *x)
{
    char namebuf[MAXPDSTRING];
    t_canvasenvironment *env = canvas_getenv(x);
    if (!x->gl_havewindow)
    {
        bug("canvas_reflecttitle");
        return;
    }
    if (env->ce_argc)
    {
        int i;
        strcpy(namebuf, " (");
        for (i = 0; i < env->ce_argc; i++)
        {
            if (strlen(namebuf) > MAXPDSTRING/2 - 5)
                break;
            if (i != 0)
                strcat(namebuf, " ");
            atom_string(&env->ce_argv[i], namebuf + strlen(namebuf),
                MAXPDSTRING/2);
        }
        strcat(namebuf, ")");
    }
    else namebuf[0] = 0;
    if (x->gl_edit)
    {
        strncat(namebuf, " [edit]", MAXPDSTRING-strlen(namebuf)-1);
        namebuf[MAXPDSTRING-1] = 0;
    }
    pdgui_vmess("pdtk_canvas_reflecttitle", "^ sss i",
        x,
        canvas_getdir(x)->s_name, x->gl_name->s_name, namebuf,
        x->gl_dirty);
}